

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFNameTreeObjectHelper.hh
# Opt level: O2

void __thiscall QPDFNameTreeObjectHelper::iterator::~iterator(iterator *this)

{
  ~iterator(this);
  operator_delete(this,0x48);
  return;
}

Assistant:

virtual ~iterator() = default;